

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zeMemCloseIpcHandle(ze_context_handle_t hContext,void *ptr)

{
  ze_pfnMemCloseIpcHandle_t pfnCloseIpcHandle;
  dditable_t *dditable;
  ze_result_t result;
  void *ptr_local;
  ze_context_handle_t hContext_local;
  
  if (*(code **)(*(long *)(hContext + 8) + 0x3f0) == (code *)0x0) {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hContext_local._4_4_ =
         (**(code **)(*(long *)(hContext + 8) + 0x3f0))(*(undefined8 *)hContext,ptr);
  }
  return hContext_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemCloseIpcHandle(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const void* ptr                                 ///< [in][release] pointer to device allocation in this process
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_context_object_t*>( hContext )->dditable;
        auto pfnCloseIpcHandle = dditable->ze.Mem.pfnCloseIpcHandle;
        if( nullptr == pfnCloseIpcHandle )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hContext = reinterpret_cast<ze_context_object_t*>( hContext )->handle;

        // forward to device-driver
        result = pfnCloseIpcHandle( hContext, ptr );

        return result;
    }